

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_comparison_expression.cpp
# Opt level: O3

void duckdb::ExpressionBinder::TestCollation(ClientContext *context,string *collation)

{
  pointer pcVar1;
  CollationBinding *this;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_80;
  string local_78;
  Value local_58;
  
  Value::Value(&local_58,anon_var_dwarf_4ed193b + 9);
  make_uniq_base<duckdb::Expression,duckdb::BoundConstantExpression,duckdb::Value>
            ((duckdb *)&local_80,&local_58);
  Value::~Value(&local_58);
  pcVar1 = (collation->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + collation->_M_string_length);
  LogicalType::VARCHAR_COLLATION(&local_58.type_,&local_78);
  this = CollationBinding::Get(context);
  CollationBinding::PushCollation
            (this,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_80,&local_58.type_,ALL_COLLATIONS);
  LogicalType::~LogicalType(&local_58.type_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_80._M_head_impl != (Expression *)0x0) {
    (*((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return;
}

Assistant:

void ExpressionBinder::TestCollation(ClientContext &context, const string &collation) {
	auto expr = make_uniq_base<Expression, BoundConstantExpression>(Value(""));
	PushCollation(context, expr, LogicalType::VARCHAR_COLLATION(collation));
}